

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void test<long>(long expected,string *value)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  char *in_R9;
  AssertHelper local_c8;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  long result2;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  string local_78;
  AssertHelper local_58;
  Message local_50 [3];
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  long result;
  string *psStack_18;
  bool valid;
  string *value_local;
  long expected_local;
  
  psStack_18 = value;
  value_local = (string *)expected;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  lVar3 = std::__cxx11::string::c_str();
  lVar4 = std::__cxx11::string::size();
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       jsteemann::atoi<long>(pcVar2,(char *)(lVar3 + lVar4),(bool *)((long)&result + 7));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_38,(bool *)((long)&result + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_38,(AssertionResult *)0x193d6c,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(local_50);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    testing::internal::EqHelper<false>::Compare<long,long>
              ((EqHelper<false> *)local_90,"expected","result",(long *)&value_local,
               (long *)&gtest_ar_.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_98);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&result2,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                 ,0x19,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&result2,&local_98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result2);
      testing::Message::~Message(&local_98);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      lVar3 = std::__cxx11::string::c_str();
      lVar4 = std::__cxx11::string::size();
      gtest_ar_1.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           jsteemann::atoi_unchecked<long>(pcVar2,(char *)(lVar3 + lVar4));
      testing::internal::EqHelper<false>::Compare<long,long>
                ((EqHelper<false> *)local_b8,"expected","result2",(long *)&value_local,
                 (long *)&gtest_ar_1.message_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar1) {
        testing::Message::Message(&local_c0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                   ,0x1c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::Message::~Message(&local_c0);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    }
  }
  return;
}

Assistant:

static void test(T expected, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_TRUE(valid);
  ASSERT_EQ(expected, result);
  
  T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
  ASSERT_EQ(expected, result2);
}